

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

bool __thiscall
QPDF::CopiedStreamDataProvider::provideStreamData
          (CopiedStreamDataProvider *this,QPDFObjGen *og,Pipeline *pipeline,bool suppress_warnings,
          bool will_retry)

{
  QPDF *this_00;
  bool bVar1;
  __shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<QPDF::ForeignStreamData> foreign_data;
  mapped_type foreign_stream;
  __shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var2 = &std::
            map<QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>_>_>_>
            ::operator[](&this->foreign_stream_data,og)->
            super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,p_Var2);
  if (local_60._M_ptr == (element_type *)0x0) {
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[](&this->foreign_streams,og);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,p_Var3);
    bVar1 = QPDFObjectHandle::pipeStreamData
                      ((QPDFObjectHandle *)&local_50,pipeline,(bool *)0x0,0,qpdf_dl_none,
                       suppress_warnings,will_retry);
    p_Var3 = &local_50;
  }
  else {
    this_00 = this->destination_qpdf;
    std::__shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2> *)&local_40,
               &local_60);
    bVar1 = pipeForeignStreamData
                      (this_00,(shared_ptr<QPDF::ForeignStreamData> *)&local_40,pipeline,
                       suppress_warnings,will_retry);
    p_Var3 = &local_40;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var3->_M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return bVar1;
}

Assistant:

bool
QPDF::CopiedStreamDataProvider::provideStreamData(
    QPDFObjGen const& og, Pipeline* pipeline, bool suppress_warnings, bool will_retry)
{
    std::shared_ptr<ForeignStreamData> foreign_data = foreign_stream_data[og];
    bool result = false;
    if (foreign_data.get()) {
        result = destination_qpdf.pipeForeignStreamData(
            foreign_data, pipeline, suppress_warnings, will_retry);
        QTC::TC("qpdf", "QPDF copy foreign with data", result ? 0 : 1);
    } else {
        auto foreign_stream = foreign_streams[og];
        result = foreign_stream.pipeStreamData(
            pipeline, nullptr, 0, qpdf_dl_none, suppress_warnings, will_retry);
        QTC::TC("qpdf", "QPDF copy foreign with foreign_stream", result ? 0 : 1);
    }
    return result;
}